

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptNumber::ToLocaleStringIntl
          (ArgumentReader *args,CallInfo callInfo,ScriptContext *scriptContext)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  JavascriptLibrary *pJVar7;
  EngineInterfaceObject *this;
  IntlEngineInterfaceExtensionObject *this_00;
  ThreadContext *pTVar8;
  Var pvVar9;
  RecyclableObject *pRVar10;
  JavascriptString *pJVar11;
  Arguments local_c8;
  Var local_b8;
  Var result;
  double value;
  undefined1 local_98 [8];
  AutoReentrancyHandler autoReentrancyHandler_1;
  Arguments local_78;
  undefined1 local_68 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  JavascriptFunction *func;
  IntlEngineInterfaceExtensionObject *intlExtensionObject;
  EngineInterfaceObject *nativeEngineInterfaceObj;
  ScriptContext *scriptContext_local;
  ArgumentReader *args_local;
  CallInfo callInfo_local;
  TypeId local_18;
  TypeId typeId;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x305,"(scriptContext)","scriptContext");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((DAT_01ea4150 & 1) != 0) && (bVar3 = ScriptContext::IsIntlEnabled(scriptContext), bVar3)) {
    pJVar7 = ScriptContext::GetLibrary(scriptContext);
    this = JavascriptLibraryBase::GetEngineInterfaceObject(&pJVar7->super_JavascriptLibraryBase);
    if (this != (EngineInterfaceObject *)0x0) {
      this_00 = (IntlEngineInterfaceExtensionObject *)
                EngineInterfaceObject::GetEngineExtension(this,EngineInterfaceExtensionKind_Intl);
      autoReentrancyHandler._8_8_ =
           IntlEngineInterfaceExtensionObject::GetNumberToLocaleString(this_00);
      if ((JavascriptFunction *)autoReentrancyHandler._8_8_ != (JavascriptFunction *)0x0) {
        pTVar8 = ScriptContext::GetThreadContext(scriptContext);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_68,pTVar8);
        uVar2 = autoReentrancyHandler._8_8_;
        Arguments::Arguments(&local_78,&args->super_Arguments);
        pvVar9 = JavascriptFunction::CallFunction((JavascriptFunction *)uVar2,&local_78);
        pJVar11 = VarTo<Js::JavascriptString>(pvVar9);
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_68);
        return pJVar11;
      }
      pJVar7 = ScriptContext::GetLibrary(scriptContext);
      JavascriptLibrary::InitializeIntlForNumberPrototype(pJVar7);
      autoReentrancyHandler._8_8_ =
           IntlEngineInterfaceExtensionObject::GetNumberToLocaleString(this_00);
      if ((JavascriptFunction *)autoReentrancyHandler._8_8_ != (JavascriptFunction *)0x0) {
        pTVar8 = ScriptContext::GetThreadContext(scriptContext);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_98,pTVar8);
        uVar2 = autoReentrancyHandler._8_8_;
        Arguments::Arguments((Arguments *)&value,&args->super_Arguments);
        pvVar9 = JavascriptFunction::CallFunction((JavascriptFunction *)uVar2,(Arguments *)&value);
        pJVar11 = VarTo<Js::JavascriptString>(pvVar9);
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_98);
        return pJVar11;
      }
      autoReentrancyHandler.m_savedReentrancySafeOrHandled = false;
      autoReentrancyHandler._9_7_ = 0;
    }
  }
  pvVar9 = Arguments::operator[](&args->super_Arguments,0);
  BVar4 = GetThisValue(pvVar9,(double *)&result);
  if (BVar4 != 0) {
    pJVar11 = ToLocaleString((double)result,scriptContext);
    return pJVar11;
  }
  pvVar9 = Arguments::operator[](&args->super_Arguments,0);
  if (pvVar9 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = TaggedInt::Is(pvVar9);
  if (bVar3) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar3 = Is_NoTaggedIntCheck(pvVar9);
    if (bVar3) {
      local_18 = TypeIds_Number;
    }
    else {
      pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar9);
      if (pRVar10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(pRVar10);
      if ((0x57 < (int)local_18) && (BVar4 = RecyclableObject::IsExternal(pRVar10), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
  if (local_18 == TypeIds_HostDispatch) {
    pvVar9 = Arguments::operator[](&args->super_Arguments,0);
    pRVar10 = VarTo<Js::RecyclableObject>(pvVar9);
    Arguments::Arguments(&local_c8,&args->super_Arguments);
    iVar5 = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x55])(pRVar10,EntryToLocaleString,&local_c8,&local_b8);
    if (iVar5 != 0) {
      pJVar11 = VarTo<Js::JavascriptString>(local_b8);
      return pJVar11;
    }
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec3c,L"Number.prototype.toLocaleString");
}

Assistant:

JavascriptString* JavascriptNumber::ToLocaleStringIntl(ArgumentReader& args, CallInfo callInfo, ScriptContext* scriptContext)
    {
       Assert(scriptContext);
#ifdef ENABLE_INTL_OBJECT
        if(CONFIG_FLAG(IntlBuiltIns) && scriptContext->IsIntlEnabled()){

            EngineInterfaceObject* nativeEngineInterfaceObj = scriptContext->GetLibrary()->GetEngineInterfaceObject();
            if (nativeEngineInterfaceObj)
            {
                IntlEngineInterfaceExtensionObject* intlExtensionObject = static_cast<IntlEngineInterfaceExtensionObject*>(nativeEngineInterfaceObj->GetEngineExtension(EngineInterfaceExtensionKind_Intl));
                JavascriptFunction* func = intlExtensionObject->GetNumberToLocaleString();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return VarTo<JavascriptString>(func->CallFunction(args));
                    }
                    END_SAFE_REENTRANT_CALL
                }
                // Initialize Number.prototype.toLocaleString
                scriptContext->GetLibrary()->InitializeIntlForNumberPrototype();
                func = intlExtensionObject->GetNumberToLocaleString();
                if (func)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return VarTo<JavascriptString>(func->CallFunction(args));
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
        }
#endif

        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToLocaleString, args, &result))
                {
                    return VarTo<JavascriptString>(result);
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toLocaleString"));
        }

        return JavascriptNumber::ToLocaleString(value, scriptContext);
    }